

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

size_t __thiscall geometrycentral::surface::SurfaceMesh::nInteriorVertices(SurfaceMesh *this)

{
  bool bVar1;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  VertexSet *__range2;
  size_t nInteriorVertices;
  Vertex *in_stack_00000098;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> *in_stack_ffffffffffffff88;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
  in_stack_ffffffffffffff90;
  undefined1 local_30 [24];
  undefined1 *local_18;
  size_t local_10;
  
  local_10 = 0;
  vertices(in_stack_ffffffffffffff90.mesh);
  local_18 = local_30;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_ffffffffffffff90.mesh)
  ;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_ffffffffffffff90.mesh)
  ;
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_ffffffffffffff90.mesh,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
         RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator*
                   ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)0x1c94a8);
    bVar1 = Vertex::isBoundary(in_stack_00000098);
    if (!bVar1) {
      local_10 = local_10 + 1;
    }
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
               in_stack_ffffffffffffff90.mesh);
  }
  return local_10;
}

Assistant:

size_t SurfaceMesh::nInteriorVertices() {
  size_t nInteriorVertices = 0;
  for (const Vertex v : vertices()) {
    if (!v.isBoundary()) {
      nInteriorVertices++;
    }
  }
  return nInteriorVertices;
}